

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

int CNetBan::CNetHash::MakeHashArray(NETADDR_conflict *pAddr,CNetHash *aHash)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  int Sum;
  
  lVar1 = 0x10;
  if (pAddr->type == 1) {
    lVar1 = 4;
  }
  aHash->m_Hash = 0;
  aHash->m_HashIndex = 0;
  bVar3 = 0;
  lVar2 = 0;
  while (lVar1 != lVar2) {
    bVar3 = bVar3 + pAddr->ip[lVar2];
    aHash[lVar2 + 1].m_Hash = (uint)bVar3;
    aHash[lVar2 + 1].m_HashIndex = (int)lVar1 - 1U & (uint)(lVar2 + 1);
    lVar2 = lVar2 + 1;
  }
  return (int)lVar1;
}

Assistant:

int CNetBan::CNetHash::MakeHashArray(const NETADDR *pAddr, CNetHash aHash[17])
{
	int Length = pAddr->type==NETTYPE_IPV4 ? 4 : 16;
	aHash[0].m_Hash = 0;
	aHash[0].m_HashIndex = 0;
	for(int i = 1, Sum = 0; i <= Length; ++i)
	{
		Sum += pAddr->ip[i-1];
		aHash[i].m_Hash = Sum&0xFF;
		aHash[i].m_HashIndex = i%Length;
	}
	return Length;
}